

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

void __thiscall gui::DialogBox::draw(DialogBox *this,RenderTarget *target,RenderStates states)

{
  Widget *this_00;
  element_type *peVar1;
  pointer psVar2;
  bool bVar3;
  Transform *right;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar4;
  shared_ptr<gui::Widget> *child;
  pointer psVar5;
  float fVar6;
  Vector2f local_28;
  
  this_00 = &(this->super_Group).super_Container.super_Widget;
  bVar3 = Widget::isVisible(this_00);
  if (bVar3) {
    right = Widget::getTransform(this_00);
    sf::operator*=(&states.transform,right);
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rect_,&this->size_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->rect_,&states);
    fVar6 = sf::Shape::getOutlineThickness
                      (&(((this->style_).
                          super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->rect_).super_Shape);
    sf::Transformable::setPosition
              (&(((this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->titleBar_).super_Shape.super_Transformable,-fVar6,-fVar6);
    peVar1 = (this->style_).super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_28.x = fVar6 + fVar6 + (this->size_).x;
    local_28.y = peVar1->titleBarHeight_;
    sf::RectangleShape::setSize(&peVar1->titleBar_,&local_28);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->titleBar_,&states);
    pvVar4 = ContainerBase::getChildren((ContainerBase *)this);
    psVar2 = (pvVar4->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (pvVar4->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      sf::RenderTarget::draw
                (target,&((psVar5->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void DialogBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);
    float outlineThickness = style_->rect_.getOutlineThickness();
    style_->titleBar_.setPosition(-outlineThickness, -outlineThickness);
    style_->titleBar_.setSize({size_.x + outlineThickness * 2.0f, style_->titleBarHeight_});
    target.draw(style_->titleBar_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}